

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

void __thiscall tcmalloc::PageHeap::GetLargeSpanStatsLocked(PageHeap *this,LargeSpanStats *result)

{
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  long lVar3;
  
  result->spans = 0;
  result->normal_pages = 0;
  result->returned_pages = 0;
  p_Var1 = (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar3 = 1;
  lVar2 = 0;
  while ((_Rb_tree_header *)p_Var1 != &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header) {
    lVar2 = (long)&(p_Var1[1]._M_parent)->_M_color + lVar2;
    result->normal_pages = lVar2;
    result->spans = lVar3;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    lVar3 = lVar3 + 1;
  }
  p_Var1 = (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar2 = 0;
  while ((_Rb_tree_header *)p_Var1 != &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header) {
    lVar2 = (long)&(p_Var1[1]._M_parent)->_M_color + lVar2;
    result->returned_pages = lVar2;
    result->spans = lVar3;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void PageHeap::GetLargeSpanStatsLocked(LargeSpanStats* result) {
  ASSERT(lock_.IsHeld());
  result->spans = 0;
  result->normal_pages = 0;
  result->returned_pages = 0;
  for (SpanSetIter it = large_normal_.begin(); it != large_normal_.end(); ++it) {
    result->normal_pages += it->length;
    result->spans++;
  }
  for (SpanSetIter it = large_returned_.begin(); it != large_returned_.end(); ++it) {
    result->returned_pages += it->length;
    result->spans++;
  }
}